

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::InitialTimeZoneRule::isEquivalentTo(InitialTimeZoneRule *this,TimeZoneRule *other)

{
  bool bVar1;
  UBool UVar2;
  
  if (&this->super_TimeZoneRule == other) {
    UVar2 = '\x01';
  }
  else {
    bVar1 = std::type_info::operator!=
                      ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                       (type_info *)(other->super_UObject)._vptr_UObject[-1]);
    if (!bVar1) {
      UVar2 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other);
      return UVar2;
    }
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UBool
InitialTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    return TRUE;
}